

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ship.cpp
# Opt level: O0

void __thiscall
Ship::setPosition(Ship *this,int shipId,int shipLength,int *shipHead,int *shipTail,bool rotation)

{
  bool rotation_local;
  int *shipTail_local;
  int *shipHead_local;
  int shipLength_local;
  int shipId_local;
  Ship *this_local;
  
  this->shipId = shipId;
  this->shipLength = shipLength;
  this->cellsInFire = 0;
  this->shipHead[0] = *shipHead;
  this->shipHead[1] = shipHead[1];
  this->shipTail[0] = *shipTail;
  this->shipTail[1] = shipTail[1];
  this->rotation = rotation;
  this->isAlive = false;
  return;
}

Assistant:

void Ship::setPosition(int shipId, int shipLength, int *shipHead, int *shipTail, bool rotation)
{
    this->shipId = shipId;
    this->shipLength = shipLength;
    this->cellsInFire = 0;
    this->shipHead[0] = shipHead[0];
    this->shipHead[1] = shipHead[1];

    this->shipTail[0] = shipTail[0];
    this->shipTail[1] = shipTail[1];
    this->rotation = rotation;

    this->isAlive = false;
}